

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnOpcodeBlockSig
          (BinaryReaderObjdumpDisassemble *this,Type sig_type)

{
  bool bVar1;
  undefined8 uVar2;
  string local_48;
  Type local_28;
  BinaryReaderObjdumpDisassemble *local_20;
  BinaryReaderObjdumpDisassemble *this_local;
  Type sig_type_local;
  
  local_20 = this;
  unique0x10000128 = sig_type;
  if ((this->in_function_body & 1U) == 0) {
    Result::Result((Result *)&sig_type_local,Ok);
  }
  else {
    local_28 = sig_type;
    bVar1 = operator!=(sig_type,Void);
    if (bVar1) {
      (anonymous_namespace)::BinaryReaderObjdumpDisassemble::BlockSigToString_abi_cxx11_
                (&local_48,this,stack0xffffffffffffffec);
      uVar2 = std::__cxx11::string::c_str();
      LogOpcode(this,"%s",uVar2);
      std::__cxx11::string::~string((string *)&local_48);
    }
    else {
      LogOpcode(this,(char *)0x0);
    }
    this->indent_level = this->indent_level + 1;
    Result::Result((Result *)&sig_type_local,Ok);
  }
  return (Result)sig_type_local.enum_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeBlockSig(Type sig_type) {
  if (!in_function_body) {
    return Result::Ok;
  }
  if (sig_type != Type::Void) {
    LogOpcode("%s", BlockSigToString(sig_type).c_str());
  } else {
    LogOpcode(nullptr);
  }
  indent_level++;
  return Result::Ok;
}